

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void __thiscall
CompilerContext::compile_switch_withop
          (CompilerContext *this,SyntaxTree *swnode,
          vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *cases,
          shared_ptr<Label> *break_ptr)

{
  ulong uVar1;
  int iVar2;
  pointer pCVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppCVar4;
  undefined1 uVar5;
  vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *pvVar6;
  bool bVar7;
  uint uVar8;
  SwitchAnnotation *pSVar9;
  ulong uVar10;
  long lVar11;
  pointer ppCVar12;
  Case *c;
  long lVar13;
  pointer pCVar14;
  __normal_iterator<CompilerContext::Case_**,_std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>_>
  __i;
  pointer ppCVar15;
  shared_ptr<Label> *__args;
  Case *pCVar16;
  Case *pCVar17;
  vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> sorted_cases;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  args;
  vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> local_108;
  SyntaxTree *local_f0;
  anon_union_48_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false>_3
  local_e8;
  undefined8 local_b8;
  pointer local_a8;
  pointer pvStack_a0;
  pointer local_98;
  shared_ptr<Label> local_90;
  shared_ptr<Label> local_80;
  vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *local_70;
  shared_ptr<Label> *local_68;
  Command *local_60;
  Command *local_58;
  Command *local_50;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_48;
  
  local_108.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::resize
            (&local_108,
             ((long)(cases->
                    super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(cases->
                    super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  pSVar9 = SyntaxTree::annotation<SwitchAnnotation_const&>(swnode);
  bVar7 = pSVar9->has_default;
  local_58 = std::experimental::optional<const_Command_&>::value(&this->commands->switch_start);
  local_60 = std::experimental::optional<const_Command_&>::value(&this->commands->switch_continued);
  ppCVar4 = local_108.
            super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar12 = local_108.
             super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (cases->super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppCVar15 = local_108.
             super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (pCVar14 = (cases->
                 super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
                 _M_impl.super__Vector_impl_data._M_start; pCVar14 != pCVar3; pCVar14 = pCVar14 + 1)
  {
    *ppCVar15 = pCVar14;
    ppCVar15 = ppCVar15 + 1;
  }
  local_f0 = swnode;
  if (local_108.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_108.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar13 = (long)local_108.
                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.
                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = lVar13 >> 3;
    lVar11 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>>
              (local_108.
               super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_108.
               super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar13 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>>
                (ppCVar12,ppCVar4);
    }
    else {
      ppCVar15 = ppCVar12 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>>
                (ppCVar12,ppCVar15);
      for (; ppCVar15 != ppCVar4; ppCVar15 = ppCVar15 + 1) {
        pCVar17 = *ppCVar15;
        ppCVar12 = ppCVar15;
        if ((pCVar17->value).super_OptionalBase<int>.init_ == true) {
          while ((pCVar16 = ppCVar12[-1], (pCVar16->value).super_OptionalBase<int>.init_ != true ||
                 ((pCVar17->value).super_OptionalBase<int>.storage_.value_ <
                  (pCVar16->value).super_OptionalBase<int>.storage_.value_))) {
            *ppCVar12 = pCVar16;
            ppCVar12 = ppCVar12 + -1;
          }
        }
        *ppCVar12 = pCVar17;
      }
    }
  }
  if (bVar7 == false) {
    pCVar17 = (Case *)0x0;
  }
  else {
    pCVar17 = local_108.
              super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1];
    local_108.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_108.
         super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
    if ((pCVar17->value).super_OptionalBase<int>.init_ == true) {
      __assert_fail("case_default->is_default()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp"
                    ,0x17c,
                    "void CompilerContext::compile_switch_withop(const SyntaxTree &, std::vector<Case> &, shared_ptr<Label>)"
                   );
    }
  }
  pCVar14 = (cases->
            super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (cases->super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_70 = cases;
  if (pCVar14 != pCVar3) {
    do {
      make_internal_label((CompilerContext *)&local_e8._tail);
      this_00 = (pCVar14->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (pCVar14->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(local_e8._4_4_,
                    CONCAT22(local_e8._2_2_,CONCAT11(local_e8._1_1_,local_e8._target)));
      (pCVar14->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      pCVar14 = pCVar14 + 1;
    } while (pCVar14 != pCVar3);
  }
  if (local_108.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_108.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_68 = &pCVar17->target;
    if (bVar7 == false) {
      local_68 = break_ptr;
    }
    uVar10 = 0;
    do {
      local_a8 = (pointer)0x0;
      pvStack_a0 = (pointer)0x0;
      local_98 = (pointer)0x0;
      std::
      vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ::reserve((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                 *)&local_a8,0x12);
      local_50 = local_60;
      if (uVar10 == 0) {
        local_50 = local_58;
        get_arg((ArgVariant *)&local_e8._tail,this,
                (((local_f0->childs).
                  super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&local_a8,
                   (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                    *)&local_e8._tail);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
        ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                    *)&local_e8._tail);
        uVar5 = local_e8._1_1_;
        lVar11 = (long)local_108.
                       super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_108.
                       super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        uVar8 = (uint)lVar11;
        local_e8._target = (char)lVar11;
        local_e8._1_1_ = (undefined1)((ulong)lVar11 >> 8);
        if ((int)uVar8 < -0x80) {
          if (uVar8 < 0xffff8000) {
LAB_0016c3c4:
            local_e8._2_2_ = (undefined2)((ulong)lVar11 >> 0x10);
            local_b8 = 4;
          }
          else {
LAB_0016c3db:
            local_b8 = 3;
          }
        }
        else {
          if (0x7f < (int)uVar8) {
            if (uVar8 < 0x8000) goto LAB_0016c3db;
            goto LAB_0016c3c4;
          }
          local_b8 = 2;
          local_e8._1_1_ = uVar5;
        }
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&local_a8,
                   (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                    *)&local_e8._tail);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
        ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                    *)&local_e8._tail);
        local_b8 = 2;
        local_e8._target = bVar7;
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&local_a8,
                   (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                    *)&local_e8._tail);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
        ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                    *)&local_e8._tail);
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::emplace_back<std::shared_ptr<Label>const&>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&local_a8,local_68);
      }
      lVar11 = (ulong)(uVar10 != 0) * 2 + 7;
      uVar1 = uVar10 + lVar11;
      do {
        if (uVar10 < (ulong)((long)local_108.
                                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_108.
                                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          if ((local_108.
               super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10]->value).super_OptionalBase<int>.
              init_ == false) {
            __assert_fail("initialized()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                          ,0x204,"T &std::experimental::optional<int>::operator*() & [T = int]");
          }
          iVar2 = (local_108.
                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10]->value).super_OptionalBase<int>
                  .storage_.value_;
          local_e8._target = (char)iVar2;
          if (local_e8._target == iVar2) {
            local_b8 = 2;
          }
          else {
            local_e8._1_1_ = (undefined1)((uint)iVar2 >> 8);
            if ((short)iVar2 == iVar2) {
              local_b8 = 3;
            }
            else {
              local_e8._2_2_ = (undefined2)((uint)iVar2 >> 0x10);
              local_b8 = 4;
            }
          }
          std::
          vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
          ::
          emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                    ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                      *)&local_a8,
                     (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                      *)&local_e8._tail);
          eggs::variants::detail::
          _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
          ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                      *)&local_e8._tail);
          __args = &local_108.
                    super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar10]->target;
        }
        else {
          local_e8._target = -1;
          local_b8 = 2;
          std::
          vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
          ::
          emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                    ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                      *)&local_a8,
                     (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                      *)&local_e8._tail);
          eggs::variants::detail::
          _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
          ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                      *)&local_e8._tail);
          __args = break_ptr;
        }
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::emplace_back<std::shared_ptr<Label>&>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&local_a8,__args);
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      local_48.
      super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_a8;
      local_48.
      super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvStack_a0;
      local_48.
      super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_98;
      local_a8 = (pointer)0x0;
      pvStack_a0 = (pointer)0x0;
      local_98 = (pointer)0x0;
      compile_command(this,local_50,&local_48,false);
      std::
      vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ::~vector(&local_48);
      std::
      vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                 *)&local_a8);
      uVar10 = uVar1;
    } while (uVar1 < (ulong)((long)local_108.
                                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_108.
                                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pvVar6 = local_70;
  pCVar17 = (local_70->
            super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (pCVar17 !=
      (local_70->super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pCVar16 = pCVar17 + 1;
      local_80.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pCVar17->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_80.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pCVar17->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (local_80.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_80.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_80.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
                ((vector<CompiledData,std::allocator<CompiledData>> *)&this->compiled,&local_80);
      if (local_80.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      if ((pCVar16 ==
           (pvVar6->
           super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
           _M_impl.super__Vector_impl_data._M_finish) ||
         (bVar7 = Case::same_body_as(pCVar16,pCVar17), !bVar7)) {
        compile_statements(this,(local_f0->childs).
                                super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].
                                super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           pCVar17->first_statement_id,pCVar17->last_statement_id);
      }
      pCVar17 = pCVar16;
    } while (pCVar16 !=
             (pvVar6->
             super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_90.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (break_ptr->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_90.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (break_ptr->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_90.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_90.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_90.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
            ((vector<CompiledData,std::allocator<CompiledData>> *)&this->compiled,&local_90);
  if (local_90.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_108.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CompilerContext::compile_switch_withop(const SyntaxTree& swnode, std::vector<Case>& cases, shared_ptr<Label> break_ptr)
{
    std::vector<Case*> sorted_cases;   // does not contain default, unlike `cases`
    sorted_cases.resize(cases.size());
    bool has_default = swnode.annotation<const SwitchAnnotation&>().has_default;
    const Case* case_default = nullptr;

    const Command& switch_start     = this->commands.switch_start.value();
    const Command& switch_continued = this->commands.switch_continued.value();

    std::transform(cases.begin(), cases.end(), sorted_cases.begin(), [] (auto& c) { return std::addressof<Case>(c); });

    std::sort(sorted_cases.begin(), sorted_cases.end(), [](const Case* a, const Case* b) {
        if(a->is_default()) return false; // default should be the last
        if(b->is_default()) return true;  // !a->is_default() == true
        return *a->value < *b->value;
    });

    if(has_default)
    {
        case_default = sorted_cases.back();
        sorted_cases.pop_back();
        assert(case_default->is_default());
    }

    for(auto& c : cases)
        c.target = make_internal_label();

    for(size_t i = 0; i < sorted_cases.size(); )
    {
        std::vector<ArgVariant> args;
        args.reserve(18);

        const Command& switch_op = (i == 0? switch_start : switch_continued);
        size_t max_cases_here    = (i == 0? 7 : 9);

        if(i == 0)
        {
            args.emplace_back(get_arg(swnode.child(0)));
            args.emplace_back(conv_int(sorted_cases.size()));
            args.emplace_back(conv_int(has_default));
            args.emplace_back(has_default? case_default->target : break_ptr);
        }

        for(size_t k = 0; k < max_cases_here; ++k, ++i)
        {
            if(i < sorted_cases.size())
            {
                args.emplace_back(conv_int(*sorted_cases[i]->value));
                args.emplace_back(sorted_cases[i]->target);
            }
            else
            {
                args.emplace_back(conv_int(-1));
                args.emplace_back(break_ptr);
            }
        }

        compile_command(switch_op, std::move(args));
    }

    for(auto it = cases.begin(); it != cases.end(); ++it)
    {
        compile_label(it->target);
        if(std::next(it) == cases.end() || !std::next(it)->same_body_as(*it))
        {
            compile_statements(swnode.child(1), it->first_statement_id, it->last_statement_id);
        }
    }

    compile_label(break_ptr);
}